

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

int lrtr_get_monotonic_time(time_t *seconds)

{
  int iVar1;
  long in_FS_OFFSET;
  time_t *seconds_local;
  undefined1 local_20 [8];
  timespec time;
  
  time.tv_nsec = *(__syscall_slong_t *)(in_FS_OFFSET + 0x28);
  iVar1 = clock_gettime(1,(timespec *)local_20);
  if (iVar1 == -1) {
    seconds_local._4_4_ = -1;
  }
  else {
    *seconds = (time_t)local_20;
    if (4 < time.tv_sec * 1000000000) {
      *seconds = *seconds + 1;
    }
    seconds_local._4_4_ = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == time.tv_nsec) {
    return seconds_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

int lrtr_get_monotonic_time(time_t *seconds)
{
#if defined(__MACH__) && defined(__APPLE__)
	if (timeconvert == 0.0) {
		mach_timebase_info_data_t time_base;
		(void)mach_timebase_info(&time_base);
		timeconvert = (double)time_base.numer / (double)time_base.denom / 1000000000.0;
	}
	*seconds = (time_t)mach_absolute_time() * timeconvert;
#else
	struct timespec time;

	if (clock_gettime(CLOCK_MONOTONIC, &time) == -1)
		return -1;
	*seconds = time.tv_sec;
	if ((time.tv_nsec * 1000000000) >= 5)
		*seconds += 1;
#endif
	return 0;
}